

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileParser::getVector2
          (ObjFileParser *this,
          vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *point2d_array)

{
  char *this_00;
  pointer *ppaVar1;
  iterator __position;
  byte *pbVar2;
  aiVector2t<float> aVar3;
  byte *pbVar4;
  byte *pbVar5;
  undefined1 in_CL;
  ai_real ret;
  aiVector2t<float> local_38;
  float local_2c;
  
  this_00 = this->m_buffer;
  copyNextWord(this,this_00,0x1000);
  local_38.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_38,(float *)0x1,(bool)in_CL);
  local_2c = local_38.x;
  copyNextWord(this,this_00,0x1000);
  local_38.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_38,(float *)0x1,(bool)in_CL);
  local_38.y = local_38.x;
  local_38.x = local_2c;
  __position._M_current =
       (point2d_array->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (point2d_array->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
    _M_realloc_insert<aiVector2t<float>>
              ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)point2d_array,
               __position,&local_38);
  }
  else {
    aVar3.y = local_38.y;
    aVar3.x = local_2c;
    *__position._M_current = aVar3;
    ppaVar1 = &(point2d_array->
               super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  pbVar5 = (byte *)(this->m_DataIt)._M_current;
  pbVar2 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar2 + -1 != pbVar5 && pbVar5 != pbVar2) {
    do {
      if (((*pbVar5 < 0xe) && ((0x3401U >> (*pbVar5 & 0x1f) & 1) != 0)) ||
         (pbVar5 = pbVar5 + 1, pbVar5 == pbVar2)) break;
    } while (pbVar5 != pbVar2 + -1);
  }
  pbVar4 = pbVar5;
  if (pbVar5 != pbVar2) {
    pbVar5 = pbVar5 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar4 = pbVar5;
  }
  for (; (pbVar4 != pbVar2 && ((*pbVar4 == 0x20 || (pbVar5 = pbVar4, *pbVar4 == 9))));
      pbVar4 = pbVar4 + 1) {
    pbVar5 = pbVar2;
  }
  (this->m_DataIt)._M_current = (char *)pbVar5;
  return;
}

Assistant:

void ObjFileParser::getVector2( std::vector<aiVector2D> &point2d_array ) {
    ai_real x, y;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    point2d_array.push_back(aiVector2D(x, y));

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}